

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiverImpl.cpp
# Opt level: O1

IPipelineState * __thiscall
Diligent::ArchiverImpl::GetPipelineState(ArchiverImpl *this,PIPELINE_TYPE PSOType,char *PSOName)

{
  bool bVar1;
  int iVar2;
  ResourceType RVar3;
  iterator iVar4;
  IPipelineState *pIVar5;
  string msg;
  undefined1 local_48 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_38;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->m_PipelinesMtx);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  RVar3 = Undefined;
  switch(PSOType) {
  case PIPELINE_TYPE_GRAPHICS:
  case PIPELINE_TYPE_MESH:
    RVar3 = GraphicsPipeline;
    break;
  case PIPELINE_TYPE_COMPUTE:
    RVar3 = ComputePipeline;
    break;
  case PIPELINE_TYPE_RAY_TRACING:
    RVar3 = RayTracingPipeline;
    break;
  case PIPELINE_TYPE_LAST:
    RVar3 = TilePipeline;
    break;
  default:
    bVar1 = true;
    goto LAB_001b8bf7;
  }
  bVar1 = false;
LAB_001b8bf7:
  if (bVar1) {
    FormatString<char[25]>((string *)local_48,(char (*) [25])"Unexpected pipeline type");
    DebugAssertionFailed
              ((Char *)CONCAT44(local_48._4_4_,local_48._0_4_),"GetPipelineState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/ArchiverImpl.cpp"
               ,0x1a2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_48._4_4_,local_48._0_4_) != &aStack_38) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_48._4_4_,local_48._0_4_),aStack_38._M_allocated_capacity + 1
                     );
    }
  }
  else {
    local_48._0_4_ = RVar3;
    HashMapStringKey::HashMapStringKey((HashMapStringKey *)(local_48 + 8),PSOName,false);
    iVar4 = std::
            _Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>_>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->m_Pipelines)._M_h,(key_type *)local_48);
    if (((Char *)local_48._8_8_ != (Char *)0x0) && ((long)aStack_38._M_allocated_capacity < 0)) {
      operator_delete__((void *)local_48._8_8_);
    }
    local_48._8_8_ = (Char *)0x0;
    aStack_38._M_allocated_capacity = 0;
    if (iVar4.
        super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      pIVar5 = *(IPipelineState **)
                ((long)iVar4.
                       super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>_>,_false>
                       ._M_cur + 0x20);
      goto LAB_001b8c9c;
    }
  }
  pIVar5 = (IPipelineState *)0x0;
LAB_001b8c9c:
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_PipelinesMtx);
  return pIVar5;
}

Assistant:

IPipelineState* ArchiverImpl::GetPipelineState(PIPELINE_TYPE PSOType,
                                               const char*   PSOName)
{
    std::lock_guard<std::mutex> Guard{m_PipelinesMtx};

    const auto ResType = PiplineTypeToArchiveResourceType(PSOType);
    if (ResType == ResourceType::Undefined)
    {
        UNEXPECTED("Unexpected pipeline type");
        return nullptr;
    }

    auto it = m_Pipelines.find(NamedResourceKey{ResType, PSOName});
    return it != m_Pipelines.end() ? it->second.RawPtr() : nullptr;
}